

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

StringRef Catch::trim(StringRef ref)

{
  char cVar1;
  StringRef *pSVar2;
  StringRef SVar3;
  size_t real_end;
  size_t real_begin;
  anon_class_1_0_00000001 is_ws;
  bool local_49;
  undefined7 in_stack_ffffffffffffffc0;
  undefined1 uVar4;
  StringRef *pSVar5;
  StringRef *this;
  anon_class_1_0_00000001 local_21;
  StringRef local_20 [2];
  
  pSVar5 = (StringRef *)0x0;
  while( true ) {
    this = pSVar5;
    pSVar2 = (StringRef *)StringRef::size(local_20);
    uVar4 = false;
    if (pSVar5 < pSVar2) {
      cVar1 = StringRef::operator[](local_20,(size_type)this);
      uVar4 = trim::anon_class_1_0_00000001::operator()(&local_21,cVar1);
    }
    if ((bool)uVar4 == false) break;
    pSVar5 = (StringRef *)((long)&this->m_start + 1);
  }
  pSVar5 = (StringRef *)StringRef::size(local_20);
  while( true ) {
    local_49 = false;
    if (this < pSVar5) {
      cVar1 = StringRef::operator[](local_20,(size_type)((long)&pSVar5[-1].m_size + 7));
      local_49 = trim::anon_class_1_0_00000001::operator()(&local_21,cVar1);
    }
    if (local_49 == false) break;
    pSVar5 = (StringRef *)((long)&pSVar5[-1].m_size + 7);
  }
  SVar3 = StringRef::substr(this,(size_type)pSVar5,CONCAT17(uVar4,in_stack_ffffffffffffffc0));
  return SVar3;
}

Assistant:

StringRef trim(StringRef ref) {
        const auto is_ws = [](char c) {
            return c == ' ' || c == '\t' || c == '\n' || c == '\r';
        };
        size_t real_begin = 0;
        while (real_begin < ref.size() && is_ws(ref[real_begin])) { ++real_begin; }
        size_t real_end = ref.size();
        while (real_end > real_begin && is_ws(ref[real_end - 1])) { --real_end; }

        return ref.substr(real_begin, real_end - real_begin);
    }